

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

ostream * CLI::detail::format_aliases
                    (ostream *out,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *aliases,size_t wid)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  pointer pbVar4;
  string local_90;
  string local_70;
  string local_50;
  
  if ((aliases->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (aliases->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    *(long *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = (long)(int)wid;
    ::std::__ostream_insert<char,std::char_traits<char>>(out,"     aliases: ",0xe);
    pbVar4 = (aliases->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (aliases->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar4 != pbVar1) {
      bVar3 = true;
      do {
        if (!bVar3) {
          ::std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
        }
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"              ","");
        pcVar2 = (pbVar4->_M_dataplus)._M_p;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar2,pcVar2 + pbVar4->_M_string_length);
        fix_newlines(&local_70,&local_90,&local_50);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (out,local_70._M_dataplus._M_p,local_70._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        pbVar4 = pbVar4 + 1;
        bVar3 = false;
      } while (pbVar4 != pbVar1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
  }
  return out;
}

Assistant:

CLI11_INLINE std::ostream &format_aliases(std::ostream &out, const std::vector<std::string> &aliases, std::size_t wid) {
    if(!aliases.empty()) {
        out << std::setw(static_cast<int>(wid)) << "     aliases: ";
        bool front = true;
        for(const auto &alias : aliases) {
            if(!front) {
                out << ", ";
            } else {
                front = false;
            }
            out << detail::fix_newlines("              ", alias);
        }
        out << "\n";
    }
    return out;
}